

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O3

int __thiscall wasm::ShellExternalInterface::init(ShellExternalInterface *this,EVP_PKEY_CTX *ctx)

{
  undefined8 *puVar1;
  key_type *__k;
  key_type *__k_00;
  mapped_type *this_00;
  mapped_type *this_01;
  EVP_PKEY_CTX *extraout_RAX;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *import;
  undefined8 *puVar2;
  unordered_map<wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>_>_>
  *this_02;
  Memory local_58;
  ShellExternalInterface *local_38;
  
  puVar2 = *(undefined8 **)(ctx + 0x78);
  puVar1 = *(undefined8 **)(ctx + 0x80);
  local_38 = this;
  if (puVar2 != puVar1) {
    do {
      __k = (key_type *)*puVar2;
      if (__k[2].super_IString.str._M_len == 0) {
        local_58.memory.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.memory.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_58.memory.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        Memory::resize(&local_58,(long)__k[3].super_IString.str._M_str << 0x10);
        this_00 = std::
                  map<wasm::Name,_wasm::ShellExternalInterface::Memory,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::ShellExternalInterface::Memory>_>_>
                  ::operator[](&this->memories,__k);
        std::vector<char,_std::allocator<char>_>::operator=(&this_00->memory,&local_58.memory);
        if (local_58.memory.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.memory.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.memory.super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.memory.super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar1);
  }
  puVar2 = *(undefined8 **)(ctx + 0xa8);
  puVar1 = *(undefined8 **)(ctx + 0xb0);
  if (puVar2 != puVar1) {
    this_02 = &local_38->tables;
    do {
      __k_00 = (key_type *)*puVar2;
      if (__k_00[2].super_IString.str._M_len == 0) {
        this_01 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_02,__k_00);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::resize
                  (this_01,(size_type)__k_00[3].super_IString.str._M_str);
        ctx = extraout_RAX;
      }
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar1);
  }
  return (int)ctx;
}

Assistant:

void init(Module& wasm, ModuleRunner& instance) override {
    ModuleUtils::iterDefinedMemories(wasm, [&](wasm::Memory* memory) {
      auto shellMemory = Memory();
      shellMemory.resize(memory->initial * wasm::Memory::kPageSize);
      memories[memory->name] = shellMemory;
    });
    ModuleUtils::iterDefinedTables(
      wasm, [&](Table* table) { tables[table->name].resize(table->initial); });
  }